

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O0

void eltcalc::OutputQuantiles
               (summarySampleslevelHeader *sh,vector<float,_std::allocator<float>_> *losses_vec,
               FILE *outFile)

{
  bool bVar1;
  iterator __first;
  pointer ppVar2;
  OASIS_FLOAT loss_00;
  iterator iStack_40;
  OASIS_FLOAT loss;
  _Self local_38;
  iterator it;
  FILE *outFile_local;
  vector<float,_std::allocator<float>_> *losses_vec_local;
  summarySampleslevelHeader *sh_local;
  
  __first = std::vector<float,_std::allocator<float>_>::begin(losses_vec);
  it._M_node = (_Base_ptr)std::vector<float,_std::allocator<float>_>::end(losses_vec);
  std::sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __first._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)it._M_node);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>::
       begin((map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
              *)intervals_);
  while( true ) {
    iStack_40 = std::
                map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                ::end((map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                       *)intervals_);
    bVar1 = std::operator!=(&local_38,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_float,_interval>_>::operator->(&local_38);
    loss_00 = GetQuantileLoss(&ppVar2->second,losses_vec);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_float,_interval>_>::operator->(&local_38);
    OutputQuantilesCsv(outFile,sh,ppVar2->first,loss_00);
    std::_Rb_tree_iterator<std::pair<const_float,_interval>_>::operator++(&local_38);
  }
  return;
}

Assistant:

void OutputQuantiles(const summarySampleslevelHeader& sh,
			     std::vector<OASIS_FLOAT>& losses_vec,
			     FILE * outFile)
	{

		std::sort(losses_vec.begin(), losses_vec.end());

		for (std::map<float, interval>::iterator it = intervals_.begin();
		     it != intervals_.end(); ++it) {

			OASIS_FLOAT loss = GetQuantileLoss(it->second, losses_vec);
			OutputQuantilesCsv(outFile, sh, it->first, loss);

		}

	}